

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O2

ScalarFunction * duckdb::ListSelectFun::GetFunction(void)

{
  LogicalType varargs;
  long lVar1;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffedc;
  FunctionNullHandling in_stack_fffffffffffffee8;
  bind_lambda_function_t in_stack_fffffffffffffef0;
  code *local_108 [2];
  code *local_f8;
  code *local_f0;
  LogicalType local_e8;
  LogicalType local_d0;
  LogicalType local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a0;
  LogicalType local_88;
  LogicalType local_70;
  LogicalType local_58 [2];
  
  LogicalType::LogicalType(&local_70,ANY);
  LogicalType::LIST(local_58,&local_70);
  LogicalType::LogicalType(&local_b8,BIGINT);
  LogicalType::LIST(local_58 + 1,&local_b8);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a0,__l,(allocator_type *)&stack0xfffffffffffffef7);
  LogicalType::LogicalType(&local_e8,ANY);
  LogicalType::LIST(&local_d0,&local_e8);
  local_108[1] = (code *)0x0;
  local_108[0] = ListSelectFunction<duckdb::SetSelectionVectorSelect>;
  local_f0 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_f8 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  LogicalType::LogicalType(&local_88,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_88;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffed4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffedc;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_a0,&local_d0,
             (scalar_function_t *)local_108,ListSelectBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
  LogicalType::~LogicalType(&local_88);
  ::std::_Function_base::~_Function_base((_Function_base *)local_108);
  LogicalType::~LogicalType(&local_d0);
  LogicalType::~LogicalType(&local_e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_b8);
  LogicalType::~LogicalType(&local_70);
  return in_RDI;
}

Assistant:

ScalarFunction ListSelectFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::LIST(LogicalTypeId::ANY), LogicalType::LIST(LogicalType::BIGINT)},
	                          LogicalType::LIST(LogicalTypeId::ANY), ListSelectFunction<SetSelectionVectorSelect>,
	                          ListSelectBind);
	return fun;
}